

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall cmGeneratorTarget::AddSourceCommon(cmGeneratorTarget *this,string *src)

{
  pointer *pppTVar1;
  iterator __position;
  undefined8 uVar2;
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  undefined1 local_70 [56];
  cmListFileBacktrace local_38;
  
  cmMakefile::GetBacktrace(&local_38,this->Makefile);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)(local_70 + 0x18),&local_38)
  ;
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_70,(string *)(local_70 + 0x18));
  uVar2 = local_70._0_8_;
  local_70._0_8_ = (cmState *)0x0;
  local_70._8_8_ = uVar2;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_70);
  *(bool *)(uVar2 + 0x178) = true;
  local_70._0_8_ = operator_new(0x10);
  local_70._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  local_70._16_8_ = 0;
  *(undefined8 *)&(((cmState *)local_70._0_8_)->PropertyDefinitions)._M_t._M_impl = uVar2;
  *(cmLinkImplItem **)
   &(((cmState *)local_70._0_8_)->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header
       = &TargetPropertyEntry::NoLinkImplItem;
  __position._M_current =
       (this->SourceEntries).
       super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->SourceEntries).
      super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
    ::_M_realloc_insert<cmGeneratorTarget::TargetPropertyEntry*>
              ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
                *)&this->SourceEntries,__position,(TargetPropertyEntry **)local_70);
  }
  else {
    *__position._M_current = (TargetPropertyEntry *)local_70._0_8_;
    pppTVar1 = &(this->SourceEntries).
                super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_70 + 0x10));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
  ::clear(&(this->KindedSourcesMap)._M_t);
  this->LinkImplementationLanguageIsContextDependent = true;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_70 + 8));
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_70 + 0x18));
  cmListFileBacktrace::~cmListFileBacktrace(&local_38);
  return;
}

Assistant:

void cmGeneratorTarget::AddSourceCommon(const std::string& src)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  cmGeneratorExpression ge(lfbt);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(src);
  cge->SetEvaluateForBuildsystem(true);
  this->SourceEntries.push_back(new TargetPropertyEntry(cge));
  this->KindedSourcesMap.clear();
  this->LinkImplementationLanguageIsContextDependent = true;
}